

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-shutdown-after-write.c
# Opt level: O2

int run_test_tcp_shutdown_after_write(void)

{
  int iVar1;
  undefined8 uVar2;
  char *pcVar3;
  char *pcVar4;
  int64_t eval_b;
  int64_t eval_a;
  sockaddr_in addr;
  
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,&addr);
  eval_a = (int64_t)iVar1;
  if (eval_a == 0) {
    uVar2 = uv_default_loop();
    iVar1 = uv_timer_init(uVar2,&timer);
    eval_a = (int64_t)iVar1;
    if (eval_a == 0) {
      iVar1 = uv_timer_start(&timer,timer_cb,0x7d,0);
      eval_a = (int64_t)iVar1;
      if (eval_a == 0) {
        iVar1 = uv_tcp_init(uVar2,&conn);
        eval_a = (int64_t)iVar1;
        if (eval_a == 0) {
          iVar1 = uv_tcp_connect(&connect_req,&conn,&addr,connect_cb);
          eval_a = (int64_t)iVar1;
          if (eval_a == 0) {
            iVar1 = uv_run(uVar2,0);
            eval_a = (int64_t)iVar1;
            eval_b = 0;
            if (eval_a == 0) {
              eval_a = 1;
              eval_b = (int64_t)connect_cb_called;
              if (eval_b == 1) {
                eval_a = 1;
                eval_b = (int64_t)write_cb_called;
                if (eval_b == 1) {
                  eval_a = 1;
                  eval_b = (int64_t)shutdown_cb_called;
                  if (eval_b == 1) {
                    eval_a = 1;
                    eval_b = (int64_t)conn_close_cb_called;
                    if (eval_b == 1) {
                      eval_a = 1;
                      eval_b = (int64_t)timer_close_cb_called;
                      if (eval_b == 1) {
                        uv_walk(uVar2,close_walk_cb,0);
                        uv_run(uVar2,0);
                        eval_a = 0;
                        iVar1 = uv_loop_close(uVar2);
                        eval_b = (int64_t)iVar1;
                        if (eval_b == 0) {
                          uv_library_shutdown();
                          return 0;
                        }
                        pcVar4 = "uv_loop_close(loop)";
                        pcVar3 = "0";
                        uVar2 = 0x88;
                      }
                      else {
                        pcVar4 = "timer_close_cb_called";
                        pcVar3 = "1";
                        uVar2 = 0x86;
                      }
                    }
                    else {
                      pcVar4 = "conn_close_cb_called";
                      pcVar3 = "1";
                      uVar2 = 0x85;
                    }
                  }
                  else {
                    pcVar4 = "shutdown_cb_called";
                    pcVar3 = "1";
                    uVar2 = 0x84;
                  }
                }
                else {
                  pcVar4 = "write_cb_called";
                  pcVar3 = "1";
                  uVar2 = 0x83;
                }
              }
              else {
                pcVar4 = "connect_cb_called";
                pcVar3 = "1";
                uVar2 = 0x82;
              }
            }
            else {
              pcVar4 = "0";
              pcVar3 = "r";
              uVar2 = 0x80;
            }
            goto LAB_0018eecd;
          }
          pcVar3 = "r";
          uVar2 = 0x7d;
        }
        else {
          pcVar3 = "r";
          uVar2 = 0x77;
        }
      }
      else {
        pcVar3 = "r";
        uVar2 = 0x74;
      }
    }
    else {
      pcVar3 = "r";
      uVar2 = 0x71;
    }
  }
  else {
    pcVar3 = "uv_ip4_addr(\"127.0.0.1\", 9123, &addr)";
    uVar2 = 0x6d;
  }
  eval_b = 0;
  pcVar4 = "0";
LAB_0018eecd:
  fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tcp-shutdown-after-write.c"
          ,uVar2,pcVar3,"==",pcVar4,eval_a,"==",eval_b);
  abort();
}

Assistant:

TEST_IMPL(tcp_shutdown_after_write) {
  struct sockaddr_in addr;
  uv_loop_t* loop;
  int r;

  ASSERT_OK(uv_ip4_addr("127.0.0.1", TEST_PORT, &addr));
  loop = uv_default_loop();

  r = uv_timer_init(loop, &timer);
  ASSERT_OK(r);

  r = uv_timer_start(&timer, timer_cb, 125, 0);
  ASSERT_OK(r);

  r = uv_tcp_init(loop, &conn);
  ASSERT_OK(r);

  r = uv_tcp_connect(&connect_req,
                     &conn,
                     (const struct sockaddr*) &addr,
                     connect_cb);
  ASSERT_OK(r);

  r = uv_run(loop, UV_RUN_DEFAULT);
  ASSERT_OK(r);

  ASSERT_EQ(1, connect_cb_called);
  ASSERT_EQ(1, write_cb_called);
  ASSERT_EQ(1, shutdown_cb_called);
  ASSERT_EQ(1, conn_close_cb_called);
  ASSERT_EQ(1, timer_close_cb_called);

  MAKE_VALGRIND_HAPPY(loop);
  return 0;
}